

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall QTableView::sizeHintForRow(QTableView *this,int row)

{
  QPersistentModelIndex *this_00;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar1;
  bool bVar2;
  int iVar3;
  int visualIndex;
  int iVar4;
  int iVar5;
  QAbstractItemModel *pQVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  int local_170;
  QModelIndex local_158;
  QModelIndex local_140;
  QModelIndex local_128;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar6 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar6 == (QAbstractItemModel *)0x0) {
    local_170 = -1;
  }
  else {
    QWidget::ensurePolished((QWidget *)this);
    iVar3 = QHeaderView::resizeContentsPrecision(this_01->verticalHeader);
    iVar8 = 0;
    visualIndex = QHeaderView::visualIndexAt(this_01->horizontalHeader,0);
    if (visualIndex < 1) {
      visualIndex = 0;
    }
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar4 = QHeaderView::visualIndexAt
                      (this_01->horizontalHeader,
                       ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1);
    if (iVar4 == -1) {
      pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_108,&(this_01->super_QAbstractItemViewPrivate).root);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_108);
      iVar4 = iVar4 + -1;
    }
    memset(&local_108,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2f8))(this,&local_108);
    local_128.r = -1;
    local_128.c = -1;
    local_128.i = 0;
    local_128.m.ptr = (QAbstractItemModel *)0x0;
    local_170 = 0;
    iVar5 = visualIndex;
    if (visualIndex <= iVar4) {
      local_170 = 0;
      iVar9 = visualIndex;
      do {
        iVar5 = QHeaderView::logicalIndex(this_01->horizontalHeader,iVar9);
        bVar2 = QHeaderView::isSectionHidden(this_01->horizontalHeader,iVar5);
        iVar7 = iVar8;
        if (!bVar2) {
          pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    (&local_158,&(this_01->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar6 + 0x60))(&local_140,pQVar6,row,iVar5,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_170 = QTableViewPrivate::heightHintForIndex(this_01,&local_128,local_170,&local_108)
          ;
          iVar7 = iVar8 + 1;
          iVar8 = iVar3;
          iVar5 = iVar9;
          if (iVar7 == iVar3) break;
        }
        iVar8 = iVar7;
        iVar9 = iVar9 + 1;
        iVar5 = iVar4 + 1;
      } while (iVar4 + 1 != iVar9);
    }
    pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
    this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_140,this_00);
    iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))(pQVar6,&local_140);
    if ((iVar8 != iVar3 && iVar3 != 0) && visualIndex < iVar4) {
      iVar4 = iVar4 + -1;
      iVar5 = iVar5 + -1;
      do {
        if ((visualIndex < 1) && (iVar4 <= iVar5)) break;
        if ((((byte)iVar8 & 0 < visualIndex) == 0) && (iVar5 != iVar4)) {
          iVar9 = iVar4;
          if (iVar4 < iVar5) {
            iVar9 = iVar5;
          }
          do {
            if (iVar9 == iVar5) goto LAB_0058a71f;
            iVar5 = iVar5 + 1;
            iVar7 = QHeaderView::logicalIndex(this_01->horizontalHeader,iVar5);
            bVar2 = QHeaderView::isSectionHidden(this_01->horizontalHeader,iVar7);
          } while (bVar2);
        }
        else {
          do {
            iVar9 = iVar5;
            if (visualIndex < 1) goto LAB_0058a71f;
            visualIndex = visualIndex + -1;
            iVar7 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
            bVar2 = QHeaderView::isSectionHidden(this_01->horizontalHeader,iVar7);
          } while (bVar2);
        }
        iVar9 = iVar5;
        if (-1 < iVar7) {
          pQVar6 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_158,this_00);
          (**(code **)(*(long *)pQVar6 + 0x60))(&local_140,pQVar6,row,iVar7,&local_158);
          local_128.m.ptr = local_140.m.ptr;
          local_128.r = local_140.r;
          local_128.c = local_140.c;
          local_128.i = local_140.i;
          local_170 = QTableViewPrivate::heightHintForIndex(this_01,&local_128,local_170,&local_108)
          ;
        }
LAB_0058a71f:
        iVar5 = iVar9;
        iVar8 = iVar8 + 1;
      } while (iVar8 != iVar3);
    }
    bVar2 = this_01->showGrid;
    QBrush::~QBrush(&local_108.backgroundBrush);
    if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_170 = local_170 + (uint)bVar2;
    QIcon::~QIcon(&local_108.icon);
    QLocale::~QLocale(&local_108.locale);
    QFont::~QFont(&local_108.font);
    QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_170;
}

Assistant:

int QTableView::sizeHintForRow(int row) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessCols = d->verticalHeader->resizeContentsPrecision();


    int left = qMax(0, d->horizontalHeader->visualIndexAt(0));
    int right = d->horizontalHeader->visualIndexAt(d->viewport->width());
    if (right == -1) // the table don't have enough columns to fill the viewport
        right = d->model->columnCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    QModelIndex index;
    int columnsProcessed = 0;
    int column = left;
    for (; column <= right; ++column) {
        int logicalColumn = d->horizontalHeader->logicalIndex(column);
        if (d->horizontalHeader->isSectionHidden(logicalColumn))
            continue;
        index = d->model->index(row, logicalColumn, d->root);
        hint = d->heightHintForIndex(index, hint, option);

        ++columnsProcessed;
        if (columnsProcessed == maximumProcessCols)
            break;
    }

    const int actualRight = d->model->columnCount(d->root) - 1;
    int idxLeft = left;
    int idxRight = column - 1;

    if (maximumProcessCols == 0 || actualRight < idxLeft)
        columnsProcessed = maximumProcessCols; // skip the while loop

    while (columnsProcessed != maximumProcessCols && (idxLeft > 0 || idxRight < actualRight)) {
        int logicalIdx  = -1;

        if ((columnsProcessed % 2 && idxLeft > 0) || idxRight == actualRight) {
            while (idxLeft > 0) {
                --idxLeft;
                int logcol = d->horizontalHeader->logicalIndex(idxLeft);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        } else {
            while (idxRight < actualRight) {
                ++idxRight;
                int logcol = d->horizontalHeader->logicalIndex(idxRight);
                if (d->horizontalHeader->isSectionHidden(logcol))
                    continue;
                logicalIdx = logcol;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(row, logicalIdx, d->root);
            hint = d->heightHintForIndex(index, hint, option);
        }
        ++columnsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}